

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobHashTable.h
# Opt level: O2

void __thiscall
ValueHashTable<ExprHash,_Value_*>::~ValueHashTable(ValueHashTable<ExprHash,_Value_*> *this)

{
  SListBase<HashBucket<ExprHash,_Value_*>,_Memory::ArenaAllocator,_RealCount> *pSVar1;
  JitArenaAllocator *this_00;
  SListBase<HashBucket<ExprHash,_Value_*>,_Memory::ArenaAllocator,_RealCount> *pSVar2;
  SListBase<HashBucket<ExprHash,_Value_*>,_Memory::ArenaAllocator,_RealCount> *buffer;
  ulong uVar3;
  
  for (uVar3 = 0; uVar3 < this->tableSize; uVar3 = uVar3 + 1) {
    this_00 = this->alloc;
    pSVar1 = this->table + uVar3;
    buffer = (SListBase<HashBucket<ExprHash,_Value_*>,_Memory::ArenaAllocator,_RealCount> *)
             this->table[uVar3].super_SListNodeBase<Memory::ArenaAllocator>.next;
    while (buffer != pSVar1) {
      pSVar2 = (SListBase<HashBucket<ExprHash,_Value_*>,_Memory::ArenaAllocator,_RealCount> *)
               (buffer->super_SListNodeBase<Memory::ArenaAllocator>).next;
      Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::Free
                ((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)this_00,
                 buffer,0x18);
      buffer = pSVar2;
    }
    (pSVar1->super_SListNodeBase<Memory::ArenaAllocator>).next =
         &pSVar1->super_SListNodeBase<Memory::ArenaAllocator>;
    (pSVar1->super_RealCount).count = 0;
  }
  return;
}

Assistant:

~ValueHashTable()
    {
        for (uint i = 0; i< tableSize; i++)
        {
            table[i].Clear(alloc);
        }
    }